

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_string_utf8_index_set(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp i,sexp ch)

{
  undefined1 auVar1 [16];
  sexp psVar2;
  sexp_uint_t sStack_30;
  
  if ((((ulong)str & 3) == 0) && (str->tag == 9)) {
    if (((ulong)i & 1) == 0) {
      sStack_30 = 2;
    }
    else {
      if ((char)ch == '\x1e') {
        if ((str->field_0x5 & 1) != 0) {
          psVar2 = sexp_xtype_exception(ctx,self,"string-set!: immutable string",str);
          return psVar2;
        }
        psVar2 = sexp_string_index_to_cursor(ctx,self,n,str,i);
        if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
          auVar1._8_8_ = (long)psVar2 >> 0x3f;
          auVar1._0_8_ = (ulong)psVar2 & 0xfffffffffffffffd;
          if ((str->value).uvector.length <= SUB168(auVar1 / SEXT816(8),0)) {
            psVar2 = sexp_user_exception(ctx,self,"string-set!: index out of range",i);
            return psVar2;
          }
          sexp_string_utf8_set(ctx,str,psVar2,ch);
          psVar2 = (sexp)&DAT_0000043e;
        }
        return psVar2;
      }
      sStack_30 = 4;
      i = ch;
    }
  }
  else {
    sStack_30 = 9;
    i = str;
  }
  psVar2 = sexp_type_exception(ctx,self,sStack_30,i);
  return psVar2;
}

Assistant:

sexp sexp_string_utf8_index_set (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp i, sexp ch) {
  sexp off;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, i);
  sexp_assert_type(ctx, sexp_charp, SEXP_CHAR, ch);
  if (sexp_immutablep(str))
    return sexp_xtype_exception(ctx, self, "string-set!: immutable string", str);
  off = sexp_string_index_to_cursor(ctx, self, n, str, i);
  if (sexp_exceptionp(off)) return off;
  if (sexp_unbox_string_cursor(off) >= (sexp_sint_t)sexp_string_size(str))
    return sexp_user_exception(ctx, self, "string-set!: index out of range", i);
  sexp_string_utf8_set(ctx, str, off, ch);
  return SEXP_VOID;
}